

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O1

string * __thiscall
spvtools::spvInstructionBinaryToText_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,spv_target_env env,uint32_t *instCode,
          size_t instWordCount,uint32_t *code,size_t wordCount,uint32_t options)

{
  size_type sVar1;
  _Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false> this_00;
  spv_text text_00;
  bool bVar2;
  spv_context context;
  FriendlyNameMapper *this_01;
  undefined4 in_register_00000014;
  NameMapper name_mapper;
  spv_text text;
  AssemblyGrammar grammar;
  WrappedDisassembler wrapped;
  Disassembler disassembler;
  _Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false> local_320;
  undefined8 local_318;
  uint32_t *local_310;
  _Any_data local_308;
  code *local_2f8;
  undefined8 uStack_2f0;
  _Any_data local_2e8;
  code *local_2d8;
  undefined8 uStack_2d0;
  spv_text local_2c8;
  AssemblyGrammar local_2c0;
  _Any_data *local_2a0;
  undefined8 local_298;
  uint32_t *local_290;
  _Any_data local_288;
  code *local_278;
  code *pcStack_270;
  
  context = spvContextCreate((spv_target_env)this);
  local_2c0.target_env_ = context->target_env;
  local_2c0.operandTable_ = context->operand_table;
  local_2c0.opcodeTable_ = context->opcode_table;
  local_2c0.extInstTable_ = context->ext_inst_table;
  bVar2 = AssemblyGrammar::isValid(&local_2c0);
  if (bVar2) {
    local_320._M_head_impl = (FriendlyNameMapper *)0x0;
    local_310 = instCode;
    GetTrivialNameMapper_abi_cxx11_();
    local_318 = CONCAT44(in_register_00000014,env);
    if ((wordCount & 0x40) != 0) {
      this_01 = (FriendlyNameMapper *)operator_new(0x90);
      FriendlyNameMapper::FriendlyNameMapper(this_01,context,(uint32_t *)instWordCount,(size_t)code)
      ;
      std::
      __uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
      ::reset((__uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
               *)&local_320,this_01);
      local_288._8_8_ = 0;
      local_288._M_unused._M_object = local_320._M_head_impl;
      pcStack_270 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/name_mapper.h:73:12)>
                    ::_M_invoke;
      local_278 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/name_mapper.h:73:12)>
                  ::_M_manager;
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&local_308,
                  (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&local_288);
      if (local_278 != (code *)0x0) {
        (*local_278)(&local_288,&local_288,__destroy_functor);
      }
    }
    local_2e8._M_unused._M_object = (void *)0x0;
    local_2e8._8_8_ = 0;
    local_2d8 = (code *)0x0;
    uStack_2d0 = 0;
    if (local_2f8 != (code *)0x0) {
      (*local_2f8)(&local_2e8,&local_308,__clone_functor);
      local_2d8 = local_2f8;
      uStack_2d0 = uStack_2f0;
    }
    anon_unknown_0::Disassembler::Disassembler
              ((Disassembler *)&local_288,&local_2c0,(uint32_t)wordCount,(NameMapper *)&local_2e8);
    if (local_2d8 != (code *)0x0) {
      (*local_2d8)(&local_2e8,&local_2e8,__destroy_functor);
    }
    local_298 = local_318;
    local_290 = local_310;
    local_2a0 = &local_288;
    spvBinaryParse(context,&local_2a0,(uint32_t *)instWordCount,(size_t)code,
                   anon_unknown_0::DisassembleTargetHeader,
                   anon_unknown_0::DisassembleTargetInstruction,(spv_diagnostic *)0x0);
    local_2c8 = (spv_text)0x0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    anon_unknown_0::Disassembler::SaveTextResult((Disassembler *)&local_288,&local_2c8);
    text_00 = local_2c8;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)local_2c8->str);
    while ((sVar1 = __return_storage_ptr__->_M_string_length, sVar1 != 0 &&
           ((__return_storage_ptr__->_M_dataplus)._M_p[sVar1 - 1] == '\n'))) {
      std::__cxx11::string::_M_erase((ulong)__return_storage_ptr__,sVar1 - 1);
    }
    spvTextDestroy(text_00);
    spvContextDestroy(context);
    anon_unknown_0::Disassembler::~Disassembler((Disassembler *)&local_288);
    if (local_2f8 != (code *)0x0) {
      (*local_2f8)(&local_308,&local_308,__destroy_functor);
    }
    this_00._M_head_impl = local_320._M_head_impl;
    if (local_320._M_head_impl != (FriendlyNameMapper *)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&((local_320._M_head_impl)->used_names_)._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this_00._M_head_impl);
      operator_delete(this_00._M_head_impl,0x90);
    }
  }
  else {
    spvContextDestroy(context);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string spvInstructionBinaryToText(const spv_target_env env,
                                       const uint32_t* instCode,
                                       const size_t instWordCount,
                                       const uint32_t* code,
                                       const size_t wordCount,
                                       const uint32_t options) {
  spv_context context = spvContextCreate(env);
  const AssemblyGrammar grammar(context);
  if (!grammar.isValid()) {
    spvContextDestroy(context);
    return "";
  }

  // Generate friendly names for Ids if requested.
  std::unique_ptr<FriendlyNameMapper> friendly_mapper;
  NameMapper name_mapper = GetTrivialNameMapper();
  if (options & SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES) {
    friendly_mapper = MakeUnique<FriendlyNameMapper>(context, code, wordCount);
    name_mapper = friendly_mapper->GetNameMapper();
  }

  // Now disassemble!
  Disassembler disassembler(grammar, options, name_mapper);
  WrappedDisassembler wrapped(&disassembler, instCode, instWordCount);
  spvBinaryParse(context, &wrapped, code, wordCount, DisassembleTargetHeader,
                 DisassembleTargetInstruction, nullptr);

  spv_text text = nullptr;
  std::string output;
  if (disassembler.SaveTextResult(&text) == SPV_SUCCESS) {
    output.assign(text->str, text->str + text->length);
    // Drop trailing newline characters.
    while (!output.empty() && output.back() == '\n') output.pop_back();
  }
  spvTextDestroy(text);
  spvContextDestroy(context);

  return output;
}